

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

void threadsafe_mem_leak_free(void *buffer,char *file,size_t line)

{
  MemoryLeakDetector *pMVar1;
  SimpleMutex *mtx;
  TestMemoryAllocator *allocator;
  MemLeakScopedMutex lock;
  ScopedMutexLock SStack_28;
  
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  mtx = MemoryLeakDetector::getMutex(pMVar1);
  ScopedMutexLock::ScopedMutexLock(&SStack_28,mtx);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  MemoryLeakDetector::invalidateMemory(pMVar1,(char *)buffer);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentMallocAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,allocator,buffer,file,line,true);
  ScopedMutexLock::~ScopedMutexLock(&SStack_28);
  return;
}

Assistant:

static void threadsafe_mem_leak_free(void* buffer, const char* file, size_t line)
{
    MemLeakScopedMutex lock;
    MemoryLeakWarningPlugin::getGlobalDetector()->invalidateMemory((char*) buffer);
    MemoryLeakWarningPlugin::getGlobalDetector()->deallocMemory(getCurrentMallocAllocator(), (char*) buffer, file, line, true);
}